

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O1

void __thiscall BronKerbosch::degeneracy_order(BronKerbosch *this)

{
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
  *p_Var1;
  size_t *psVar2;
  ulong *puVar3;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
  *p_Var4;
  size_type num_bits;
  iterator __position;
  _Base_ptr p_Var5;
  pointer pdVar6;
  _Base_ptr p_Var7;
  list<unsigned_long,_std::allocator<unsigned_long>_> *plVar8;
  list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
  *plVar9;
  vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
  *pvVar10;
  pointer pppVar11;
  mapped_type *pmVar12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  _Base_ptr p_Var15;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
  *p_Var16;
  _Node_alloc_type *__alloc;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
  *p_Var17;
  _Base_ptr p_Var18;
  BronKerbosch *pBVar19;
  size_type ind;
  size_type s;
  allocator_type local_71;
  pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_> *local_70;
  size_t local_68;
  BronKerbosch *local_60;
  _Base_ptr local_58 [4];
  _Base_ptr local_38;
  
  p_Var14 = (this->actives_->
            super__List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  local_60 = this;
  if (p_Var14 != (_List_node_base *)this->actives_) {
    do {
      local_70 = *(pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
                   **)((long)(p_Var14[1]._M_next + 1) + 8);
      p_Var4 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                *)this->degree_map_;
      p_Var1 = p_Var4 + 8;
      p_Var16 = p_Var1;
      for (p_Var17 = *(_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                       **)(p_Var4 + 0x10);
          p_Var17 !=
          (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
           *)0x0; p_Var17 = *(_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                              **)(p_Var17 +
                                 (ulong)(*(pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
                                           **)(p_Var17 + 0x20) < local_70) * 8 + 0x10)) {
        if (*(pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
              **)(p_Var17 + 0x20) >= local_70) {
          p_Var16 = p_Var17;
        }
      }
      p_Var17 = p_Var1;
      if ((p_Var16 != p_Var1) &&
         (p_Var17 = p_Var16,
         local_70 <
         *(pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
           **)(p_Var16 + 0x20))) {
        p_Var17 = p_Var1;
      }
      if (p_Var17 == p_Var1) {
        std::__cxx11::
        list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
        ::list((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                *)local_58,1,(value_type *)(p_Var14 + 1),(allocator_type *)&local_68);
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
        ::
        _M_emplace_unique<unsigned_long&,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>
                  (p_Var4,(unsigned_long *)&local_70,
                   (list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                    *)local_58);
        p_Var18 = local_58[0];
        while (p_Var18 != (_Base_ptr)local_58) {
          p_Var5 = *(_Base_ptr *)p_Var18;
          operator_delete(p_Var18);
          p_Var18 = p_Var5;
        }
      }
      else {
        pmVar12 = std::
                  map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                  ::at((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                        *)p_Var4,(key_type_conflict1 *)&local_70);
        p_Var13 = (_List_node_base *)operator_new(0x18);
        p_Var13[1]._M_next = (_List_node_base *)p_Var14[1]._M_next;
        std::__detail::_List_node_base::_M_hook(p_Var13);
        psVar2 = &(pmVar12->
                  super__List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                  )._M_impl._M_node._M_size;
        *psVar2 = *psVar2 + 1;
      }
      this = local_60;
      p_Var13 = (((_List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                   *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      psVar2 = &(local_60->actives_->
                super__List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                )._M_impl._M_node._M_size;
      *psVar2 = *psVar2 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var14);
      p_Var14 = p_Var13;
    } while (p_Var13 != (_List_node_base *)this->actives_);
  }
  p_Var14 = (_List_node_base *)operator_new(0x18);
  (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var14->_M_next)->_M_impl).
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  p_Var14->_M_prev = (_List_node_base *)0x0;
  *(size_t *)(p_Var14 + 1) = 0;
  p_Var14->_M_prev = p_Var14;
  p_Var14->_M_next = p_Var14;
  this->order_ = (list<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var14;
  this_00 = (vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)operator_new(0x18);
  num_bits = (this->super_CliqueFinder).alignment_count;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,num_bits,0,
             (allocator<unsigned_long> *)&local_70);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(this_00,num_bits,(value_type *)local_58,(allocator_type *)&local_68);
  local_60->vertices_ = this_00;
  p_Var18 = local_58[0];
  pBVar19 = local_60;
  if (local_58[0] != (_Base_ptr)0x0) goto LAB_001533cb;
  while (p_Var1 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                   *)pBVar19->degree_map_, *(long *)(p_Var1 + 0x28) != 0) {
    __position._M_node = *(_Base_ptr *)(p_Var1 + 0x18);
    p_Var5 = __position._M_node[1]._M_parent;
    if (p_Var5 == (_Base_ptr)&__position._M_node[1]._M_parent) {
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
      ::erase_abi_cxx11_(p_Var1,__position);
    }
    else {
      p_Var18 = p_Var5->_M_left;
      __position._M_node[1]._M_right =
           (_Base_ptr)((long)&__position._M_node[1]._M_right[-1]._M_right + 7);
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5);
      for (p_Var5 = p_Var18->_M_parent; p_Var5 != (_Base_ptr)&p_Var18->_M_parent;
          p_Var5 = *(_Base_ptr *)p_Var5) {
        local_70 = (pBVar19->vertices_as_lists_->
                   super__Vector_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[(long)p_Var5->_M_left];
        local_68 = (local_70->second).
                   super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
                   _M_size;
        pdVar6 = (pBVar19->vertices_->
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (ulong *)(*(long *)&pdVar6[*(long *)p_Var18].m_bits.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl + ((ulong)local_70->first >> 6) * 8);
        *puVar3 = *puVar3 | 1L << ((byte)(_List_node_base *)local_70->first & 0x3f);
        puVar3 = (ulong *)(*(long *)&pdVar6[(long)local_70->first].m_bits.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl + (*(ulong *)p_Var18 >> 6) * 8);
        *puVar3 = *puVar3 | 1L << ((byte)*(ulong *)p_Var18 & 0x3f);
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::remove
                  (&local_70->second,(char *)p_Var18);
        pmVar12 = std::
                  map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                  ::at(pBVar19->degree_map_,&local_68);
        std::__cxx11::
        list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
        ::remove(pmVar12,(char *)&local_70);
        p_Var4 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                  *)pBVar19->degree_map_;
        p_Var15 = (_Base_ptr)(local_68 - 1);
        p_Var1 = p_Var4 + 8;
        p_Var16 = p_Var1;
        for (p_Var17 = *(_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                         **)(p_Var4 + 0x10);
            p_Var17 !=
            (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
             *)0x0; p_Var17 = *(_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                                **)(p_Var17 +
                                   (ulong)(*(_Base_ptr *)(p_Var17 + 0x20) < p_Var15) * 8 + 0x10)) {
          if (*(_Base_ptr *)(p_Var17 + 0x20) >= p_Var15) {
            p_Var16 = p_Var17;
          }
        }
        p_Var17 = p_Var1;
        if ((p_Var16 != p_Var1) && (p_Var17 = p_Var16, p_Var15 < *(_Base_ptr *)(p_Var16 + 0x20))) {
          p_Var17 = p_Var1;
        }
        if (p_Var17 == p_Var1) {
          local_38 = p_Var15;
          std::__cxx11::
          list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
          ::list((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                  *)local_58,1,&local_70,&local_71);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
          ::
          _M_emplace_unique<unsigned_long,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>
                    (p_Var4,(unsigned_long *)&local_38,
                     (list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                      *)local_58);
          p_Var15 = local_58[0];
          while (p_Var15 != (_Base_ptr)local_58) {
            p_Var7 = *(_Base_ptr *)p_Var15;
            operator_delete(p_Var15);
            p_Var15 = p_Var7;
          }
        }
        else {
          local_58[0] = p_Var15;
          pmVar12 = std::
                    map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                    ::at((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                          *)p_Var4,(key_type_conflict1 *)local_58);
          p_Var14 = (_List_node_base *)operator_new(0x18);
          p_Var14[1]._M_next = (_List_node_base *)local_70;
          std::__detail::_List_node_base::_M_hook(p_Var14);
          psVar2 = &(pmVar12->
                    super__List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                    )._M_impl._M_node._M_size;
          *psVar2 = *psVar2 + 1;
        }
        pBVar19 = local_60;
      }
      plVar8 = pBVar19->order_;
      p_Var14 = (_List_node_base *)operator_new(0x18);
      p_Var14[1]._M_next = *(_List_node_base **)p_Var18;
      std::__detail::_List_node_base::_M_hook(p_Var14);
      psVar2 = &(plVar8->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                _M_node._M_size;
      *psVar2 = *psVar2 + 1;
      p_Var5 = p_Var18->_M_parent;
      while (p_Var5 != (_Base_ptr)&p_Var18->_M_parent) {
        p_Var15 = *(_Base_ptr *)p_Var5;
        operator_delete(p_Var5);
        p_Var5 = p_Var15;
      }
LAB_001533cb:
      operator_delete(p_Var18);
    }
  }
  if (p_Var1 != (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                 *)0x0) {
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                 *)p_Var1);
    operator_delete(p_Var1);
  }
  plVar9 = pBVar19->actives_;
  if (plVar9 != (list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                 *)0x0) {
    p_Var14 = (plVar9->
              super__List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var14 != (_List_node_base *)plVar9) {
      p_Var13 = (((_List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                   *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var14);
      p_Var14 = p_Var13;
    }
    operator_delete(plVar9);
  }
  pvVar10 = pBVar19->vertices_as_lists_;
  if (pvVar10 !=
      (vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
       *)0x0) {
    pppVar11 = (pvVar10->
               super__Vector_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if (pppVar11 != (pointer)0x0) {
      operator_delete(pppVar11);
    }
    operator_delete(pvVar10);
  }
  return;
}

Assistant:

void BronKerbosch::degeneracy_order() {

    // Move all still active vertices into the degree map
    for (auto it = actives_->begin(); it != actives_->end();) {
        list<adjacency_list_t*>::size_type ind = (*it)->second.size();

        if(degree_map_->count(ind) == 0) {           
            degree_map_->emplace(ind, list<adjacency_list_t*>(1, *it) );
	//	degree_map_->insert(std::pair<std::list<adjacency_list_t*>::size_type, std::list<adjacency_list_t*>>(ind,list<adjacency_list_t*>(1, *it)));
	

        } else {
            degree_map_->at(ind).push_back(*it);
        }
        
        it = actives_->erase(it);
    }

    order_ = new list<size_t>();
    vertices_ = new vector<alignment_set_t>(alignment_count, alignment_set_t(alignment_count));

    while (not degree_map_->empty()) {
        auto it = degree_map_->begin();

        if (it->second.empty()) {
            degree_map_->erase(it);
            continue;
        }
        
        adjacency_list_t* list_vertex = it->second.front();
        it->second.pop_front();

        // Update degree map
        for (auto&& index : list_vertex->second) {
            adjacency_list_t* companion = (*vertices_as_lists_)[index];
            list<adjacency_list_t*>::size_type s = companion->second.size();

            (*vertices_)[list_vertex->first].set(companion->first);
            (*vertices_)[companion->first].set(list_vertex->first);

            companion->second.remove(list_vertex->first);

            degree_map_->at(s).remove(companion);

            if (degree_map_->count(s-1) == 0) {
                degree_map_->emplace(s-1, list<adjacency_list_t*>(1, companion) );                
		//degree_map_->insert(std::pair<std::list<adjacency_list_t*>::size_type, std::list<adjacency_list_t*>>(s-1, list<adjacency_list_t*>(1, companion)));
            } else {
                degree_map_->at(s-1).push_front(companion);
            }
        }
        order_->push_back(list_vertex->first);

        delete list_vertex;
    }

    delete degree_map_;
    delete actives_;
    delete vertices_as_lists_;
}